

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags_storage.hpp
# Opt level: O0

void __thiscall
tfl::detail::flags_storage<3UL>::flags_storage<char>
          (flags_storage<3UL> *this,char *src,size_t n,char zero,char one)

{
  invalid_argument *this_00;
  ulong uStack_38;
  char ch;
  size_t k;
  char *it;
  char one_local;
  char zero_local;
  size_t n_local;
  char *src_local;
  flags_storage<3UL> *this_local;
  
  reset(this);
  uStack_38 = 0;
  k = (size_t)(src + n);
  do {
    if (n <= uStack_38 || 2 < uStack_38) {
      return;
    }
    if (*(char *)(k - 1) == one) {
      set_bit(this,uStack_38,true);
    }
    else if (*(char *)(k - 1) != zero) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Char is not zero or one");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    uStack_38 = uStack_38 + 1;
    k = k - 1;
  } while( true );
}

Assistant:

explicit flags_storage(CharT const* src, size_t n, CharT zero, CharT one)
    {
        reset();
        auto it = src + n;
        for (size_t k = 0; k < n && k < N; ++k) {
            CharT const ch = *--it;
            if (ch == one)
                set_bit(k, true);
            else if (ch != zero)
                throw std::invalid_argument("Char is not zero or one");
        }
    }